

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O3

Float __thiscall pbrt::Triangle::Area(Triangle *this)

{
  ulong uVar1;
  long lVar2;
  float fVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar14;
  float fVar15;
  undefined1 auVar11 [16];
  float fVar16;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  lVar2 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar4 = (long)this->triIndex;
  lVar5 = *(long *)(lVar2 + 8);
  lVar2 = *(long *)(lVar2 + 0x10);
  lVar6 = (long)*(int *)(lVar5 + lVar4 * 0xc);
  lVar7 = (long)*(int *)(lVar5 + 4 + lVar4 * 0xc);
  lVar5 = (long)*(int *)(lVar5 + 8 + lVar4 * 0xc);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(lVar2 + 4 + lVar5 * 0xc);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(lVar2 + 4 + lVar6 * 0xc);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(lVar2 + lVar7 * 0xc);
  uVar1 = *(ulong *)(lVar2 + lVar6 * 0xc);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar1;
  auVar12 = vsubps_avx(auVar17,auVar8);
  auVar17 = vsubps_avx(auVar13,auVar9);
  auVar13 = vmovshdup_avx(auVar12);
  auVar9 = ZEXT416((uint)(*(float *)(lVar2 + lVar5 * 0xc) - (float)uVar1));
  auVar8 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar12,auVar9);
  auVar11 = ZEXT416((uint)(*(float *)(lVar2 + 8 + lVar7 * 0xc) - *(float *)(lVar2 + 8 + lVar6 * 0xc)
                          ));
  auVar18 = ZEXT416((uint)(auVar17._0_4_ * auVar13._0_4_));
  auVar9 = vfmsub213ss_fma(auVar9,auVar11,auVar18);
  auVar13 = vfnmadd213ss_fma(auVar13,auVar17,auVar18);
  fVar3 = auVar9._0_4_ + auVar13._0_4_;
  auVar9 = vpermi2ps_avx512vl(_DAT_0054e620,auVar17,auVar11);
  auVar11._0_4_ = auVar9._0_4_ * auVar8._0_4_;
  auVar11._4_4_ = auVar9._4_4_ * auVar8._4_4_;
  auVar11._8_4_ = auVar9._8_4_ * auVar8._8_4_;
  auVar11._12_4_ = auVar9._12_4_ * auVar8._12_4_;
  auVar13 = vfmsub213ps_fma(auVar12,auVar17,auVar11);
  auVar12 = vfnmadd213ps_fma(auVar8,auVar9,auVar11);
  fVar10 = auVar13._0_4_ + auVar12._0_4_;
  fVar14 = auVar13._4_4_ + auVar12._4_4_;
  fVar15 = auVar13._8_4_ + auVar12._8_4_;
  fVar16 = auVar13._12_4_ + auVar12._12_4_;
  auVar12._0_4_ = fVar10 * fVar10;
  auVar12._4_4_ = fVar14 * fVar14;
  auVar12._8_4_ = fVar15 * fVar15;
  auVar12._12_4_ = fVar16 * fVar16;
  auVar13 = vmovshdup_avx(auVar12);
  auVar13 = ZEXT416((uint)(auVar12._0_4_ + auVar13._0_4_ + fVar3 * fVar3));
  auVar13 = vsqrtss_avx(auVar13,auVar13);
  return auVar13._0_4_ * 0.5;
}

Assistant:

PBRT_CPU_GPU
    const TriangleMesh *GetMesh() const {
#ifdef PBRT_IS_GPU_CODE
        return (*allTriangleMeshesGPU)[meshIndex];
#else
        return (*allMeshes)[meshIndex];
#endif
    }